

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.cpp
# Opt level: O0

FSerializer * Serialize(FSerializer *arc,char *key,int8_t *value,int8_t *defval)

{
  int local_34;
  int local_30;
  int local_2c;
  int32_t vvd;
  int32_t vv;
  int8_t *defval_local;
  int8_t *value_local;
  char *key_local;
  FSerializer *arc_local;
  
  local_2c = (int)*value;
  if (defval == (int8_t *)0x0) {
    local_34 = *value + -1;
  }
  else {
    local_34 = (int)*defval;
  }
  local_30 = local_34;
  _vvd = defval;
  defval_local = value;
  value_local = key;
  key_local = (char *)arc;
  Serialize(arc,key,&local_2c,&local_30);
  *defval_local = (int8_t)local_2c;
  return (FSerializer *)key_local;
}

Assistant:

FSerializer &Serialize(FSerializer &arc, const char *key, int8_t &value, int8_t *defval)
{
	int32_t vv = value;
	int32_t vvd = defval? *defval : value-1;
	Serialize(arc, key, vv, &vvd);
	value = (int8_t)vv;
	return arc;
}